

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

TextureSwizzle * tcu::getChannelWriteSwizzle(ChannelOrder order)

{
  TextureSwizzle *pTStack_10;
  ChannelOrder order_local;
  
  switch(order) {
  case R:
    pTStack_10 = &getChannelWriteSwizzle::R;
    break;
  case A:
    pTStack_10 = &getChannelWriteSwizzle::A;
    break;
  case I:
    pTStack_10 = &getChannelWriteSwizzle::I;
    break;
  case L:
    pTStack_10 = &getChannelWriteSwizzle::L;
    break;
  case LA:
    pTStack_10 = &getChannelWriteSwizzle::LA;
    break;
  case RG:
    pTStack_10 = &getChannelWriteSwizzle::RG;
    break;
  case RA:
    pTStack_10 = &getChannelWriteSwizzle::RA;
    break;
  case RGB:
    pTStack_10 = &getChannelWriteSwizzle::RGB;
    break;
  case RGBA:
    pTStack_10 = &getChannelWriteSwizzle::RGBA;
    break;
  case ARGB:
    pTStack_10 = &getChannelWriteSwizzle::ARGB;
    break;
  case BGR:
    pTStack_10 = &getChannelWriteSwizzle::BGR;
    break;
  case BGRA:
    pTStack_10 = &getChannelWriteSwizzle::BGRA;
    break;
  case sR:
    pTStack_10 = &getChannelWriteSwizzle::R;
    break;
  case sRG:
    pTStack_10 = &getChannelWriteSwizzle::RG;
    break;
  case sRGB:
    pTStack_10 = &getChannelWriteSwizzle::RGB;
    break;
  case sRGBA:
    pTStack_10 = &getChannelWriteSwizzle::RGBA;
    break;
  case sBGR:
    pTStack_10 = &getChannelWriteSwizzle::BGR;
    break;
  case sBGRA:
    pTStack_10 = &getChannelWriteSwizzle::BGRA;
    break;
  case D:
    pTStack_10 = &getChannelWriteSwizzle::D;
    break;
  case S:
    pTStack_10 = &getChannelWriteSwizzle::S;
    break;
  case DS:
    pTStack_10 = &getChannelWriteSwizzle::INV;
    break;
  default:
    pTStack_10 = &getChannelWriteSwizzle::INV;
  }
  return pTStack_10;
}

Assistant:

const TextureSwizzle& getChannelWriteSwizzle (TextureFormat::ChannelOrder order)
{
	// make sure to update these tables when channel orders are updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELORDER_LAST == 21);

	static const TextureSwizzle INV		= {{ TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle R		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle A		= {{ TextureSwizzle::CHANNEL_3,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle I		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle L		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle LA		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_3,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle RG		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_1,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle RA		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_3,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle RGB		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_1,		TextureSwizzle::CHANNEL_2,		TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle RGBA	= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_1,		TextureSwizzle::CHANNEL_2,		TextureSwizzle::CHANNEL_3		}};
	static const TextureSwizzle BGR		= {{ TextureSwizzle::CHANNEL_2,		TextureSwizzle::CHANNEL_1,		TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle BGRA	= {{ TextureSwizzle::CHANNEL_2,		TextureSwizzle::CHANNEL_1,		TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_3		}};
	static const TextureSwizzle ARGB	= {{ TextureSwizzle::CHANNEL_3,		TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_1,		TextureSwizzle::CHANNEL_2		}};
	static const TextureSwizzle D		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};
	static const TextureSwizzle S		= {{ TextureSwizzle::CHANNEL_0,		TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST,	TextureSwizzle::CHANNEL_LAST	}};

	switch (order)
	{
		case TextureFormat::R:			return R;
		case TextureFormat::A:			return A;
		case TextureFormat::I:			return I;
		case TextureFormat::L:			return L;
		case TextureFormat::LA:			return LA;
		case TextureFormat::RG:			return RG;
		case TextureFormat::RA:			return RA;
		case TextureFormat::RGB:		return RGB;
		case TextureFormat::RGBA:		return RGBA;
		case TextureFormat::ARGB:		return ARGB;
		case TextureFormat::BGR:		return BGR;
		case TextureFormat::BGRA:		return BGRA;
		case TextureFormat::sR:			return R;
		case TextureFormat::sRG:		return RG;
		case TextureFormat::sRGB:		return RGB;
		case TextureFormat::sRGBA:		return RGBA;
		case TextureFormat::sBGR:		return BGR;
		case TextureFormat::sBGRA:		return BGRA;
		case TextureFormat::D:			return D;
		case TextureFormat::S:			return S;

		case TextureFormat::DS:
			DE_ASSERT(false); // combined formats cannot be written to
			return INV;

		default:
			DE_ASSERT(DE_FALSE);
			return INV;
	}
}